

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O2

Mark * __thiscall
bm::Mark::add(Mark *this,uint64_t iterations,nanoseconds *total,nanoseconds *max,nanoseconds *min)

{
  long lVar1;
  long lVar2;
  
  lVar1 = total->__r;
  if (lVar1 < 0) {
    if ((this->_overflow_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_bm::Mark_&)>::operator()(&this->_overflow_callback,this);
      lVar1 = total->__r;
    }
    (this->_total).__r = lVar1;
    this->_iterations = iterations;
  }
  else {
    (this->_total).__r = (this->_total).__r + lVar1;
    this->_iterations = this->_iterations + iterations;
  }
  lVar1 = (this->_max).__r;
  lVar2 = max->__r;
  if (max->__r < lVar1) {
    lVar2 = lVar1;
  }
  lVar1 = (this->_min).__r;
  (this->_max).__r = lVar2;
  if (min->__r < lVar1) {
    lVar1 = min->__r;
  }
  (this->_min).__r = lVar1;
  return this;
}

Assistant:

Mark& add(uint64_t iterations,
              const nanoseconds& total,
              const nanoseconds& max,
              const nanoseconds& min)
    {
        if (_total + total < _total)
        {
            if (_overflow_callback)
            {
                _overflow_callback(*this);
            }

            _total      = total;
            _iterations = iterations;
        }
        else
        {
            _total      += total;
            _iterations += iterations;
        }

        _max = (std::max)(_max, max);
        _min = (std::min)(_min, min);

        return *this;
    }